

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_file_read_(MPIABI_Fint *fh,void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,
                      MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_file_read_();
  return;
}

Assistant:

void mpiabi_file_read_(
  const MPIABI_Fint * fh,
  void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_file_read_(
    fh,
    buf,
    count,
    datatype,
    status,
    ierror
  );
}